

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

void elementDeclDebug(void *ctx,xmlChar *name,int type,xmlElementContentPtr content)

{
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.elementDecl(%s, %d, ...)\n",name,type);
  return;
}

Assistant:

static void
elementDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, int type,
	    xmlElementContentPtr content ATTRIBUTE_UNUSED)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.elementDecl(%s, %d, ...)\n",
            name, type);
}